

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O1

RC __thiscall QL_Manager::InsertIntoIndex(QL_Manager *this,char *recbuf,RID *recRID)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  int extraout_EAX_01;
  long lVar2;
  long lVar3;
  bool bVar4;
  IX_IndexHandle ih;
  IX_Manager local_45;
  int local_44;
  char *local_40;
  RID *local_38;
  
  if (0 < this->relEntries->attrCount) {
    lVar3 = 0x40;
    lVar2 = 0;
    local_40 = recbuf;
    local_38 = recRID;
    do {
      if (*(int *)(this->attrEntries->relName + lVar3) == -1) {
        bVar4 = true;
      }
      else {
        IX_Manager::DestroyIndex(&local_45);
        IX_Manager::DestroyIndex(this->ixm);
        iVar1 = extraout_EAX;
        if ((extraout_EAX == 0) &&
           (IX_IndexHandle::DeleteEntry((IX_IndexHandle *)&local_45), iVar1 = extraout_EAX_00,
           extraout_EAX_00 == 0)) {
          IX_Manager::DestroyIndex(this->ixm);
          bVar4 = extraout_EAX_01 == 0;
          if (!bVar4) {
            local_44 = extraout_EAX_01;
          }
        }
        else {
          bVar4 = false;
          local_44 = iVar1;
        }
        IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&local_45);
      }
      if (!bVar4) {
        return local_44;
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x54;
    } while (lVar2 < this->relEntries->attrCount);
  }
  return 0;
}

Assistant:

RC QL_Manager::InsertIntoIndex(char *recbuf, RID recRID){
  RC rc = 0;
  for(int i = 0; i < relEntries->attrCount; i++){
    AttrCatEntry aEntry = attrEntries[i];
    if(aEntry.indexNo != -1){
      IX_IndexHandle ih;
      if((rc = ixm.OpenIndex(relEntries->relName, aEntry.indexNo, ih)))
        return (rc);
      if((rc = ih.InsertEntry((void *)(recbuf + aEntry.offset), recRID)))
        return (rc);
      if((rc = ixm.CloseIndex(ih)))
        return (rc);
    }
  }
  return (0);
}